

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O1

void __thiscall features::delete_v(features *this)

{
  float *__ptr;
  unsigned_long *__ptr_00;
  
  __ptr = (this->values)._begin;
  if (__ptr != (float *)0x0) {
    free(__ptr);
  }
  (this->values)._begin = (float *)0x0;
  (this->values)._end = (float *)0x0;
  (this->values).end_array = (float *)0x0;
  __ptr_00 = (this->indicies)._begin;
  if (__ptr_00 != (unsigned_long *)0x0) {
    free(__ptr_00);
  }
  (this->indicies)._begin = (unsigned_long *)0x0;
  (this->indicies)._end = (unsigned_long *)0x0;
  (this->indicies).end_array = (unsigned_long *)0x0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::delete_v(&this->space_names);
  return;
}

Assistant:

void delete_v()
  {
    values.delete_v();
    indicies.delete_v();
    space_names.delete_v();
  }